

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall booster::locale::gnu_gettext::mo_file::load_file(mo_file *this,FILE *file)

{
  string *s;
  reference pvVar1;
  size_t sVar2;
  undefined8 uVar3;
  FILE *in_RSI;
  size_type in_RDI;
  long len;
  size_t four_bytes;
  uint32_t magic;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator *paVar4;
  string *in_stack_ffffffffffffff28;
  runtime_error *in_stack_ffffffffffffff30;
  runtime_error *this_00;
  value_type_conflict1 *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [37];
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81 [33];
  size_t local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  int local_14;
  FILE *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_20 = fread(&local_14,4,1,in_RSI);
  if (local_14 == -0x6afbed22) {
    *(undefined1 *)(in_RDI + 0x38) = 1;
  }
  else {
    if (local_14 != -0x21edfb6b) {
      local_55 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      paVar4 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Invalid file format",paVar4);
      runtime_error::runtime_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_55 = 0;
      __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    *(undefined1 *)(in_RDI + 0x38) = 0;
  }
  fseek(local_10,0,2);
  local_60 = ftell(local_10);
  if ((long)local_60 < 0) {
    local_82 = 1;
    s = (string *)__cxa_allocate_exception(0x30);
    this_00 = (runtime_error *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_81 + 1),"Wrong file object",(allocator *)this_00);
    runtime_error::runtime_error(this_00,s);
    local_82 = 0;
    __cxa_throw(s,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  fseek(local_10,0,0);
  local_83 = 0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),in_RDI,
             in_stack_ffffffffffffff40);
  pvVar1 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffff20);
  sVar2 = fread(pvVar1,1,local_60,local_10);
  if (sVar2 != (local_60 & 0xffffffff)) {
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = (allocator *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to read file",paVar4);
    runtime_error::runtime_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
  *(reference *)(in_RDI + 0x10) = pvVar1;
  *(size_t *)(in_RDI + 0x18) = local_60;
  return;
}

Assistant:

void load_file(FILE *file)
                {
                    uint32_t magic=0;
                    // if the size is wrong magic would be wrong
                    // ok to ingnore fread result
                    size_t four_bytes = fread(&magic,4,1,file);
                    (void)four_bytes; // shut GCC
                    
                    if(magic == 0x950412de)
                        native_byteorder_ = true;
                    else if(magic == 0xde120495)
                        native_byteorder_ = false;
                    else
                        throw booster::runtime_error("Invalid file format");
                    
                    fseek(file,0,SEEK_END);
                    long len=ftell(file);
                    if(len < 0) {
                        throw booster::runtime_error("Wrong file object");
                    }
                    fseek(file,0,SEEK_SET);
                    vdata_.resize(len+1,0); // +1 to make sure the vector is not empty
                    if(fread(&vdata_.front(),1,len,file)!=unsigned(len))
                        throw booster::runtime_error("Failed to read file");
                    data_ = &vdata_[0];
                    file_size_ = len;
                }